

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O3

CATNClosure * __thiscall
Centaurus::CompositeATN<unsigned_char>::build_closure
          (CATNClosure *__return_storage_ptr__,CompositeATN<unsigned_char> *this,ATNPath *path,
          int color)

{
  _Rb_tree_header *p_Var1;
  ATNStateStack stack;
  vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_> local_58
  ;
  ATNStateStack local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._vptr_ATNPath = (_func_int **)&PTR__ATNPath_0019aa40;
  local_58.
  super__Vector_base<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  build_closure_inclusive
            (this,__return_storage_ptr__,path,color,&local_38,(PriorityChain *)&local_58);
  std::vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>::
  ~vector(&local_58);
  std::
  vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ::~vector(&local_38.
             super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           );
  return __return_storage_ptr__;
}

Assistant:

CATNClosure build_closure(const ATNPath& path, int color) const
    {
        CATNClosure closure;

        ATNStateStack stack;

        build_closure_inclusive(closure, path, color, stack, PriorityChain());

        return closure;
    }